

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::generateRandomConfig
          (IterationConfig *__return_storage_ptr__,BBoxRenderCase *this,int seed,
          IVec2 *renderTargetSize)

{
  uint uVar1;
  deUint32 dVar2;
  uint uVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Random rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  (__return_storage_ptr__->bbox).max.m_data[0] = 0.0;
  (__return_storage_ptr__->bbox).max.m_data[1] = 0.0;
  (__return_storage_ptr__->bbox).max.m_data[2] = 0.0;
  (__return_storage_ptr__->bbox).max.m_data[3] = 0.0;
  (__return_storage_ptr__->bbox).min.m_data[0] = 0.0;
  (__return_storage_ptr__->bbox).min.m_data[1] = 0.0;
  (__return_storage_ptr__->bbox).min.m_data[2] = 0.0;
  (__return_storage_ptr__->bbox).min.m_data[3] = 0.0;
  *(undefined8 *)(__return_storage_ptr__->patternPos).m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->patternSize).m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->viewportPos).m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->viewportSize).m_data = 0;
  iVar4 = renderTargetSize->m_data[0];
  if (0x1ff < renderTargetSize->m_data[0]) {
    iVar4 = 0x200;
  }
  dVar2 = deRandom_getUint32(&local_40);
  uVar1 = dVar2 % (iVar4 - 0xffU);
  (__return_storage_ptr__->viewportSize).m_data[0] = uVar1 + 0x100;
  iVar4 = 0x200;
  if (renderTargetSize->m_data[1] < 0x200) {
    iVar4 = renderTargetSize->m_data[1];
  }
  dVar2 = deRandom_getUint32(&local_40);
  uVar3 = dVar2 % (iVar4 - 0xffU);
  (__return_storage_ptr__->viewportSize).m_data[1] = uVar3 + 0x100;
  iVar4 = renderTargetSize->m_data[0];
  dVar2 = deRandom_getUint32(&local_40);
  (__return_storage_ptr__->viewportPos).m_data[0] = dVar2 % ((iVar4 - uVar1) - 0xff);
  iVar4 = renderTargetSize->m_data[1];
  dVar2 = deRandom_getUint32(&local_40);
  (__return_storage_ptr__->viewportPos).m_data[1] = dVar2 % ((iVar4 - uVar3) - 0xff);
  fVar5 = deRandom_getFloat(&local_40);
  fVar5 = fVar5 + 0.4;
  (__return_storage_ptr__->patternSize).m_data[0] = fVar5;
  fVar6 = deRandom_getFloat(&local_40);
  fVar6 = fVar6 + 0.4;
  (__return_storage_ptr__->patternSize).m_data[1] = fVar6;
  fVar7 = deRandom_getFloat(&local_40);
  fVar7 = fVar7 * ((1.0 - fVar5) + 1.0) + -1.0;
  (__return_storage_ptr__->patternPos).m_data[0] = fVar7;
  fVar8 = deRandom_getFloat(&local_40);
  fVar8 = fVar8 * ((1.0 - fVar6) + 1.0) + -1.0;
  (__return_storage_ptr__->patternPos).m_data[1] = fVar8;
  (__return_storage_ptr__->bbox).min.m_data[0] = fVar7;
  (__return_storage_ptr__->bbox).min.m_data[1] = fVar8;
  (__return_storage_ptr__->bbox).min.m_data[2] = 0.0;
  (__return_storage_ptr__->bbox).min.m_data[3] = 1.0;
  fVar10 = fVar5 + fVar7;
  fVar11 = fVar6 + fVar8;
  (__return_storage_ptr__->bbox).max.m_data[0] = fVar10;
  (__return_storage_ptr__->bbox).max.m_data[1] = fVar11;
  (__return_storage_ptr__->bbox).max.m_data[2] = 0.0;
  (__return_storage_ptr__->bbox).max.m_data[3] = 1.0;
  if (this->m_bboxSize == BBOXSIZE_SMALLER) {
    fVar9 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).min.m_data[0] = fVar9 * 0.4 * fVar5 + fVar7;
    fVar7 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).min.m_data[1] = fVar7 * 0.4 * fVar6 + fVar8;
    fVar7 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).max.m_data[0] = fVar7 * -0.4 * fVar5 + fVar10;
    fVar5 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).max.m_data[1] = fVar5 * -0.4 * fVar6 + fVar11;
  }
  else if (this->m_bboxSize == BBOXSIZE_LARGER) {
    fVar5 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).min.m_data[0] = fVar7 - fVar5 * 0.5;
    fVar5 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).min.m_data[1] = fVar8 - fVar5 * 0.5;
    fVar5 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).min.m_data[2] = 0.0 - fVar5 * 0.5;
    fVar5 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).max.m_data[0] = fVar5 * 0.5 + fVar10;
    fVar5 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).max.m_data[1] = fVar5 * 0.5 + fVar11;
    fVar5 = deRandom_getFloat(&local_40);
    (__return_storage_ptr__->bbox).max.m_data[2] = fVar5 * 0.5 + 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

BBoxRenderCase::IterationConfig BBoxRenderCase::generateRandomConfig (int seed, const tcu::IVec2& renderTargetSize) const
{
	de::Random		rnd		(seed);
	IterationConfig	config;

	// viewport config
	config.viewportSize.x()	= rnd.getInt(MIN_VIEWPORT_SIZE, de::min<int>(renderTargetSize.x(), MAX_VIEWPORT_SIZE));
	config.viewportSize.y()	= rnd.getInt(MIN_VIEWPORT_SIZE, de::min<int>(renderTargetSize.y(), MAX_VIEWPORT_SIZE));
	config.viewportPos.x()	= rnd.getInt(0, renderTargetSize.x() - config.viewportSize.x());
	config.viewportPos.y()	= rnd.getInt(0, renderTargetSize.y() - config.viewportSize.y());

	// pattern location inside viewport
	config.patternSize.x()	= rnd.getFloat(0.4f, 1.4f);
	config.patternSize.y()	= rnd.getFloat(0.4f, 1.4f);
	config.patternPos.x()	= rnd.getFloat(-1.0f, 1.0f - config.patternSize.x());
	config.patternPos.y()	= rnd.getFloat(-1.0f, 1.0f - config.patternSize.y());

	// accurate bounding box
	config.bbox.min			= tcu::Vec4(config.patternPos.x(), config.patternPos.y(), 0.0f, 1.0f);
	config.bbox.max			= tcu::Vec4(config.patternPos.x() + config.patternSize.x(), config.patternPos.y() + config.patternSize.y(), 0.0f, 1.0f);

	if (m_bboxSize == BBOXSIZE_LARGER)
	{
		// increase bbox size
		config.bbox.min.x() -= rnd.getFloat() * 0.5f;
		config.bbox.min.y() -= rnd.getFloat() * 0.5f;
		config.bbox.min.z() -= rnd.getFloat() * 0.5f;

		config.bbox.max.x() += rnd.getFloat() * 0.5f;
		config.bbox.max.y() += rnd.getFloat() * 0.5f;
		config.bbox.max.z() += rnd.getFloat() * 0.5f;
	}
	else if (m_bboxSize == BBOXSIZE_SMALLER)
	{
		// reduce bbox size
		config.bbox.min.x() += rnd.getFloat() * 0.4f * config.patternSize.x();
		config.bbox.min.y() += rnd.getFloat() * 0.4f * config.patternSize.y();

		config.bbox.max.x() -= rnd.getFloat() * 0.4f * config.patternSize.x();
		config.bbox.max.y() -= rnd.getFloat() * 0.4f * config.patternSize.y();
	}

	return config;
}